

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O1

void __thiscall
EmitNoXml::tagField(EmitNoXml *this,char *ptr,syntax_highlight hl,Datatype *ct,int4 off)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_EmitXml).s;
  if (ptr != (char *)0x0) {
    sVar2 = strlen(ptr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,ptr,sVar2);
    return;
  }
  std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  return;
}

Assistant:

virtual void tagField(const char *ptr,syntax_highlight hl,const Datatype *ct,int4 off) {
    *s << ptr; }